

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classification.hpp
# Opt level: O2

void __thiscall
boost::algorithm::detail::is_any_ofF<char>::is_any_ofF
          (is_any_ofF<char> *this,is_any_ofF<char> *Other)

{
  ulong __n;
  is_any_ofF<char> *__dest;
  
  __n = Other->m_Size;
  this->m_Size = __n;
  (this->m_Storage).m_dynSet = (set_value_type *)0x0;
  __dest = this;
  if (0x10 < __n) {
    __dest = (is_any_ofF<char> *)operator_new__(__n);
    (this->m_Storage).m_dynSet = (set_value_type *)__dest;
    Other = (is_any_ofF<char> *)(Other->m_Storage).m_dynSet;
  }
  memcpy(__dest,Other,__n);
  return;
}

Assistant:

is_any_ofF(const is_any_ofF& Other) : m_Size(Other.m_Size)
                {
                    // Prepare storage
                    m_Storage.m_dynSet=0;               
                    const set_value_type* SrcStorage=0;
                    set_value_type* DestStorage=0;

                    if(use_fixed_storage(m_Size))
                    {
                        // Use fixed storage
                        DestStorage=&m_Storage.m_fixSet[0];
                        SrcStorage=&Other.m_Storage.m_fixSet[0];
                    }
                    else
                    {
                        // Use dynamic storage
                        m_Storage.m_dynSet=new set_value_type[m_Size];
                        DestStorage=m_Storage.m_dynSet;
                        SrcStorage=Other.m_Storage.m_dynSet;
                    }

                    // Use fixed storage
                    ::std::memcpy(DestStorage, SrcStorage, sizeof(set_value_type)*m_Size);
                }